

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioContextDemuxer.cpp
# Opt level: O0

int __thiscall IOContextDemuxer::get_byte(IOContextDemuxer *this)

{
  byte *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  uint8_t *data;
  int readRez;
  uint32_t readedBytes;
  IOContextDemuxer *this_local;
  
  data._4_4_ = 0;
  data._0_4_ = 0;
  if (this->m_curPos == this->m_bufEnd) {
    _readRez = this;
    iVar2 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                      (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(long)&data + 4,&data,0)
    ;
    if ((data._4_4_ != 0) && ((int)data == 0)) {
      (*this->m_bufferedReader->_vptr_AbstractReader[5])
                (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(ulong)data._4_4_);
    }
    this->m_lastReadRez = (int)data;
    this->m_curPos = (uint8_t *)(CONCAT44(extraout_var,iVar2) + 0xbc);
    this->m_bufEnd = this->m_curPos + data._4_4_;
    if (this->m_curPos == this->m_bufEnd) {
      this->m_isEOF = true;
      return 0;
    }
  }
  this->m_processedBytes = this->m_processedBytes + 1;
  pbVar1 = this->m_curPos;
  this->m_curPos = pbVar1 + 1;
  return (uint)*pbVar1;
}

Assistant:

int IOContextDemuxer::get_byte()
{
    uint32_t readedBytes = 0;
    int readRez = 0;
    if (m_curPos == m_bufEnd)
    {
        uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez);  // blocked read mode
        if (readedBytes > 0 && readRez == 0)
            m_bufferedReader->notify(m_readerID, readedBytes);
        m_lastReadRez = readRez;
        m_curPos = data + 188;
        m_bufEnd = m_curPos + readedBytes;
        if (m_curPos == m_bufEnd)
        {
            m_isEOF = true;
            return 0;
        }
    }
    m_processedBytes++;
    return *m_curPos++;
}